

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

int f(sunrealtype t,N_Vector c,N_Vector cdot,void *user_data)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  WebData in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype in_XMM0_Qa;
  sunrealtype sVar8;
  WebData wdata;
  sunrealtype *cdotdata;
  sunrealtype *cdata;
  sunrealtype dy;
  sunrealtype dx;
  sunrealtype *fsave;
  sunrealtype *coy;
  sunrealtype *cox;
  sunrealtype y;
  sunrealtype x;
  sunrealtype dcyui;
  sunrealtype dcyli;
  sunrealtype dcxui;
  sunrealtype dcxli;
  int mxns;
  int ns;
  int jy;
  int jx;
  int iyoff;
  int idyu;
  int idyl;
  int idxu;
  int idxl;
  int ici;
  int ic;
  int i;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  WebData wdata_00;
  sunrealtype *psVar9;
  N_Vector c_00;
  int local_48;
  int local_44;
  int local_24;
  
  lVar6 = N_VGetArrayPointer(in_RDI);
  lVar7 = N_VGetArrayPointer(in_RSI);
  iVar2 = in_RDX->ns;
  psVar9 = in_RDX->fsave;
  c_00 = (N_Vector)in_RDX->coy;
  iVar3 = in_RDX->mxns;
  wdata_00 = (WebData)in_RDX->dx;
  dVar1 = in_RDX->dy;
  for (local_48 = 0; local_48 < 0x14; local_48 = local_48 + 1) {
    local_c4 = iVar3;
    if (local_48 == 0x13) {
      local_c4 = -iVar3;
    }
    local_c8 = iVar3;
    if (local_48 == 0) {
      local_c8 = -iVar3;
    }
    for (local_44 = 0; local_44 < 0x14; local_44 = local_44 + 1) {
      iVar4 = iVar3 * local_48 + iVar2 * local_44;
      WebRates((double)local_44 * (double)wdata_00,(double)local_48 * dVar1,in_XMM0_Qa,
               (sunrealtype *)(lVar6 + (long)iVar4 * 8),psVar9 + iVar4,in_RDX);
      local_cc = iVar2;
      if (local_44 == 0x13) {
        local_cc = -iVar2;
      }
      local_d0 = iVar2;
      if (local_44 == 0) {
        local_d0 = -iVar2;
      }
      for (local_24 = 1; local_24 <= iVar2; local_24 = local_24 + 1) {
        iVar5 = iVar4 + local_24 + -1;
        *(double *)(lVar7 + (long)iVar5 * 8) =
             (double)(&c_00->content)[local_24 + -1] *
             ((*(double *)(lVar6 + (long)(iVar5 + local_c4) * 8) -
              *(double *)(lVar6 + (long)iVar5 * 8)) -
             (*(double *)(lVar6 + (long)iVar5 * 8) -
             *(double *)(lVar6 + (long)(iVar5 - local_c8) * 8))) +
             in_RDX->cox[local_24 + -1] *
             ((*(double *)(lVar6 + (long)(iVar5 + local_cc) * 8) -
              *(double *)(lVar6 + (long)iVar5 * 8)) -
             (*(double *)(lVar6 + (long)iVar5 * 8) -
             *(double *)(lVar6 + (long)(iVar5 - local_d0) * 8))) + psVar9[iVar5];
      }
    }
  }
  sVar8 = doubleIntgr(c_00,(int)((ulong)psVar9 >> 0x20),wdata_00);
  *(sunrealtype *)(lVar7 + 0x4b00) = sVar8;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector c, N_Vector cdot, void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, dx, dy;
  sunrealtype *cdata, *cdotdata;
  WebData wdata;

  wdata    = (WebData)user_data;
  cdata    = N_VGetArrayPointer(c);
  cdotdata = N_VGetArrayPointer(cdot);

  mxns  = wdata->mxns;
  ns    = wdata->ns;
  fsave = wdata->fsave;
  cox   = wdata->cox;
  coy   = wdata->coy;
  mxns  = wdata->mxns;
  dx    = wdata->dx;
  dy    = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRates(x, y, t, cdata + ic, fsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cdata[ici] - cdata[ici - idyl];
        dcyui = cdata[ici + idyu] - cdata[ici];
        /* Do differencing in x. */
        dcxli = cdata[ici] - cdata[ici - idxl];
        dcxui = cdata[ici + idxu] - cdata[ici];
        /* Collect terms and load cdot elements. */
        cdotdata[ici] = coy[i - 1] * (dcyui - dcyli) +
                        cox[i - 1] * (dcxui - dcxli) + fsave[ici];
      }
    }
  }

  /* Quadrature equation (species 1) */
  cdotdata[NEQ] = doubleIntgr(c, ISPEC, wdata);

  return (0);
}